

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O0

void __thiscall miniros::RPCManager::serverThreadFunc(RPCManager *this)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  mutex *pmVar4;
  RPCManager *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_bool> pVar5;
  iterator end_1;
  iterator it_1;
  scoped_lock<std::mutex> lock_2;
  shared_ptr<miniros::ASyncXMLRPCConnection> *connection;
  iterator __end3;
  iterator __begin3;
  set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
  *__range3;
  scoped_lock<std::mutex> lock_1;
  iterator end;
  iterator it;
  scoped_lock<std::mutex> lock;
  set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
  *in_stack_ffffffffffffff28;
  XmlRpcServer *in_stack_ffffffffffffff30;
  XmlRpcDispatch *in_stack_ffffffffffffff38;
  WallDuration *this_00;
  set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
  *__x;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  XmlRpcDispatch *in_stack_ffffffffffffff68;
  _Self local_88;
  _Self local_80 [2];
  reference local_70;
  _Self local_68;
  _Self local_60;
  set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
  *local_58;
  WallDuration local_50 [2];
  _Base_ptr local_40;
  undefined1 local_38;
  _Self local_20;
  _Self local_18 [3];
  
  disableAllSignalsInThisThread();
  setThreadName((char *)0x49688d);
  while( true ) {
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff38);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    std::scoped_lock<std::mutex>::scoped_lock
              ((scoped_lock<std::mutex> *)in_stack_ffffffffffffff30,
               (mutex_type *)in_stack_ffffffffffffff28);
    local_18[0]._M_node =
         (_Base_ptr)
         std::
         set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
         ::begin(in_stack_ffffffffffffff28);
    local_20._M_node =
         (_Base_ptr)
         std::
         set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
         ::end(in_stack_ffffffffffffff28);
    while (bVar1 = std::operator!=(local_18,&local_20), bVar1) {
      std::_Rb_tree_const_iterator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>::operator*
                ((_Rb_tree_const_iterator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_> *)
                 in_stack_ffffffffffffff30);
      peVar3 = std::
               __shared_ptr_access<miniros::ASyncXMLRPCConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::ASyncXMLRPCConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x496927);
      in_stack_ffffffffffffff68 = XmlRpc::XmlRpcServer::get_dispatch(&in_RDI->server_);
      (*peVar3->_vptr_ASyncXMLRPCConnection[2])(peVar3,in_stack_ffffffffffffff68);
      __x = &in_RDI->connections_;
      std::_Rb_tree_const_iterator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>::operator*
                ((_Rb_tree_const_iterator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_> *)
                 in_stack_ffffffffffffff30);
      pVar5 = std::
              set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
              ::insert((set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                       (value_type *)__x);
      local_40 = (_Base_ptr)pVar5.first._M_node;
      in_stack_ffffffffffffff57 = pVar5.second;
      local_38 = in_stack_ffffffffffffff57;
      std::_Rb_tree_const_iterator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>::operator++
                ((_Rb_tree_const_iterator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_> *)
                 in_stack_ffffffffffffff30);
    }
    std::
    set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
    ::clear((set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
             *)0x4969ec);
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4969f9);
    pmVar4 = &in_RDI->functions_mutex_;
    std::scoped_lock<std::mutex>::scoped_lock
              ((scoped_lock<std::mutex> *)in_stack_ffffffffffffff30,
               (mutex_type *)in_stack_ffffffffffffff28);
    XmlRpc::XmlRpcServer::work(in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x496a37);
    while (bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff38),
          bVar1) {
      this_00 = local_50;
      WallDuration::WallDuration(this_00,(double)in_stack_ffffffffffffff38);
      WallDuration::sleep(this_00,(uint)pmVar4);
      WallDuration::~WallDuration((WallDuration *)0x496a84);
    }
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff38);
    if (bVar1) break;
    local_58 = &in_RDI->connections_;
    local_60._M_node =
         (_Base_ptr)
         std::
         set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
         ::begin(in_stack_ffffffffffffff28);
    local_68._M_node =
         (_Base_ptr)
         std::
         set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
         ::end(in_stack_ffffffffffffff28);
    while (bVar1 = std::operator!=(&local_60,&local_68), bVar1) {
      local_70 = std::_Rb_tree_const_iterator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>::
                 operator*((_Rb_tree_const_iterator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>
                            *)in_stack_ffffffffffffff30);
      peVar3 = std::
               __shared_ptr_access<miniros::ASyncXMLRPCConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::ASyncXMLRPCConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x496b53);
      uVar2 = (*peVar3->_vptr_ASyncXMLRPCConnection[4])();
      if ((uVar2 & 1) != 0) {
        removeASyncConnection(in_RDI,(ASyncXMLRPCConnectionPtr *)in_stack_ffffffffffffff68);
      }
      std::_Rb_tree_const_iterator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>::operator++
                ((_Rb_tree_const_iterator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_> *)
                 in_stack_ffffffffffffff30);
    }
    std::scoped_lock<std::mutex>::scoped_lock
              ((scoped_lock<std::mutex> *)in_stack_ffffffffffffff30,
               (mutex_type *)in_stack_ffffffffffffff28);
    local_80[0]._M_node =
         (_Base_ptr)
         std::
         set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
         ::begin(in_stack_ffffffffffffff28);
    local_88._M_node =
         (_Base_ptr)
         std::
         set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
         ::end(in_stack_ffffffffffffff28);
    while (bVar1 = std::operator!=(local_80,&local_88), bVar1) {
      std::_Rb_tree_const_iterator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>::operator*
                ((_Rb_tree_const_iterator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_> *)
                 in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff30 =
           (XmlRpcServer *)
           std::
           __shared_ptr_access<miniros::ASyncXMLRPCConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<miniros::ASyncXMLRPCConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x496beb);
      in_stack_ffffffffffffff38 = XmlRpc::XmlRpcServer::get_dispatch(&in_RDI->server_);
      (*(in_stack_ffffffffffffff30->super_XmlRpcSource)._vptr_XmlRpcSource[3])
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
      in_stack_ffffffffffffff28 = &in_RDI->connections_;
      std::_Rb_tree_const_iterator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>::operator*
                ((_Rb_tree_const_iterator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_> *)
                 in_stack_ffffffffffffff30);
      std::
      set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
      ::erase((set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
               *)in_stack_ffffffffffffff30,(key_type *)in_stack_ffffffffffffff28);
      std::_Rb_tree_const_iterator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>::operator++
                ((_Rb_tree_const_iterator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_> *)
                 in_stack_ffffffffffffff30);
    }
    std::
    set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
    ::clear((set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
             *)0x496c83);
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x496c8d);
  }
  return;
}

Assistant:

void RPCManager::serverThreadFunc()
{
  disableAllSignalsInThisThread();
  setThreadName("RPCManager");

  while(!shutting_down_)
  {
    {
      std::scoped_lock<std::mutex> lock(added_connections_mutex_);
      auto it = added_connections_.begin();
      auto end = added_connections_.end();
      for (; it != end; ++it)
      {
        (*it)->addToDispatch(server_.get_dispatch());
        connections_.insert(*it);
      }

      added_connections_.clear();
    }

    // Update the XMLRPC server, blocking for at most 100ms in select()
    {
      std::scoped_lock<std::mutex> lock(functions_mutex_);
      server_.work(0.1);
    }

    while (unbind_requested_)
    {
      WallDuration(0.01).sleep();
    }

    if (shutting_down_)
    {
      return;
    }

    {
      for (auto& connection: connections_)
      {
        if (connection->check())
          removeASyncConnection(connection);
      }
    }

    {
      std::scoped_lock<std::mutex> lock(removed_connections_mutex_);
      auto it = removed_connections_.begin();
      auto end = removed_connections_.end();
      for (; it != end; ++it)
      {
        (*it)->removeFromDispatch(server_.get_dispatch());
        connections_.erase(*it);
      }

      removed_connections_.clear();
    }
  }
}